

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

void * lua_touserdata(lua_State *L,int idx)

{
  TValue *pTVar1;
  void *pvVar2;
  
  pTVar1 = index2adr(L,idx);
  if ((pTVar1->field_2).it == 0xfffffff3) {
    pvVar2 = (void *)((ulong)(pTVar1->u32).lo + 0x18);
  }
  else if (((pTVar1->field_2).it & 0xffff8000) == 0xffff0000) {
    pvVar2 = (void *)(pTVar1->u64 & 0x7fffffffffff);
  }
  else {
    pvVar2 = (void *)0x0;
  }
  return pvVar2;
}

Assistant:

LUA_API void *lua_touserdata(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  if (tvisudata(o))
    return uddata(udataV(o));
  else if (tvislightud(o))
    return lightudV(o);
  else
    return NULL;
}